

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O2

ScenarioUpperBound * __thiscall
despot::Pocman::CreateScenarioUpperBound(Pocman *this,string *name,string particle_bound_name)

{
  bool bVar1;
  PocmanSmartParticleUpperBound *this_00;
  ostream *poVar2;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_00 = (PocmanSmartParticleUpperBound *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)this_00,&this->super_DSPOMDP);
  }
  else {
    bVar1 = std::operator==(name,"APPROX");
    if (bVar1) {
      this_00 = (PocmanSmartParticleUpperBound *)operator_new(0x10);
      PocmanApproxScenarioUpperBound::PocmanApproxScenarioUpperBound
                ((PocmanApproxScenarioUpperBound *)this_00,this);
    }
    else {
      bVar1 = std::operator==(name,"SMART");
      if (!bVar1) {
        bVar1 = std::operator==(name,"DEFAULT");
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported base upper bound: ");
          poVar2 = std::operator<<(poVar2,(string *)name);
          std::endl<char,std::char_traits<char>>(poVar2);
          exit(1);
        }
      }
      this_00 = (PocmanSmartParticleUpperBound *)operator_new(0x10);
      PocmanSmartParticleUpperBound::PocmanSmartParticleUpperBound(this_00,this);
    }
  }
  return (ScenarioUpperBound *)this_00;
}

Assistant:

ScenarioUpperBound* Pocman::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "APPROX") {
		return new PocmanApproxScenarioUpperBound(this);
	} else if (name == "SMART" || name == "DEFAULT") {
		return new PocmanSmartParticleUpperBound(this);
	} else {
		cerr << "Unsupported base upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}